

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  ulong uVar30;
  ulong unaff_RBP;
  size_t mask;
  ulong *puVar31;
  byte bVar32;
  long lVar33;
  Primitive *prim;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar54 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370;
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar50 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar49 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar50 = ZEXT1664(auVar49);
  }
  puVar31 = local_2368;
  fVar2 = (query->p).field_0.field_0.x;
  auVar47._4_4_ = fVar2;
  auVar47._0_4_ = fVar2;
  auVar47._8_4_ = fVar2;
  auVar47._12_4_ = fVar2;
  auVar47._16_4_ = fVar2;
  auVar47._20_4_ = fVar2;
  auVar47._24_4_ = fVar2;
  auVar47._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.y;
  auVar48._4_4_ = fVar3;
  auVar48._0_4_ = fVar3;
  auVar48._8_4_ = fVar3;
  auVar48._12_4_ = fVar3;
  auVar48._16_4_ = fVar3;
  auVar48._20_4_ = fVar3;
  auVar48._24_4_ = fVar3;
  auVar48._28_4_ = fVar3;
  fVar4 = (query->p).field_0.field_0.z;
  auVar51._4_4_ = fVar4;
  auVar51._0_4_ = fVar4;
  auVar51._8_4_ = fVar4;
  auVar51._12_4_ = fVar4;
  auVar51._16_4_ = fVar4;
  auVar51._20_4_ = fVar4;
  auVar51._24_4_ = fVar4;
  auVar51._28_4_ = fVar4;
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar41._4_4_ = uVar5;
  auVar41._0_4_ = uVar5;
  auVar41._8_4_ = uVar5;
  auVar41._12_4_ = uVar5;
  auVar41._16_4_ = uVar5;
  auVar41._20_4_ = uVar5;
  auVar41._24_4_ = uVar5;
  auVar41._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar42._4_4_ = uVar5;
  auVar42._0_4_ = uVar5;
  auVar42._8_4_ = uVar5;
  auVar42._12_4_ = uVar5;
  auVar42._16_4_ = uVar5;
  auVar42._20_4_ = uVar5;
  auVar42._24_4_ = uVar5;
  auVar42._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar37._4_4_ = uVar5;
  auVar37._0_4_ = uVar5;
  auVar37._8_4_ = uVar5;
  auVar37._12_4_ = uVar5;
  auVar37._16_4_ = uVar5;
  auVar37._20_4_ = uVar5;
  auVar37._24_4_ = uVar5;
  auVar37._28_4_ = uVar5;
  bVar28 = false;
  auVar18 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar52 = ZEXT3264(auVar18);
  auVar53 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar18 = vsubps_avx(auVar47,auVar41);
    fVar7 = auVar41._0_4_;
    fVar8 = auVar41._4_4_;
    fVar9 = auVar41._8_4_;
    fVar10 = auVar41._12_4_;
    fVar11 = auVar41._16_4_;
    fVar12 = auVar41._20_4_;
    fVar13 = auVar41._24_4_;
    auVar15 = vsubps_avx(auVar48,auVar42);
    auVar16 = vsubps_avx(auVar51,auVar37);
    auVar43._0_4_ = fVar4 + auVar37._0_4_;
    auVar43._4_4_ = fVar4 + auVar37._4_4_;
    auVar43._8_4_ = fVar4 + auVar37._8_4_;
    auVar43._12_4_ = fVar4 + auVar37._12_4_;
    auVar43._16_4_ = fVar4 + auVar37._16_4_;
    auVar43._20_4_ = fVar4 + auVar37._20_4_;
    auVar43._24_4_ = fVar4 + auVar37._24_4_;
    auVar43._28_4_ = fVar4 + auVar37._28_4_;
    auVar54._0_4_ = fVar7 * fVar7;
    auVar54._4_4_ = fVar8 * fVar8;
    auVar54._8_4_ = fVar9 * fVar9;
    auVar54._12_4_ = fVar10 * fVar10;
    auVar54._16_4_ = fVar11 * fVar11;
    auVar54._20_4_ = fVar12 * fVar12;
    auVar54._28_36_ = in_ZMM15._28_36_;
    auVar54._24_4_ = fVar13 * fVar13;
    in_ZMM15 = ZEXT3264(auVar54._0_32_);
    auVar49 = auVar50._0_16_;
    do {
      do {
        do {
          if (puVar31 == &local_2378) {
            return bVar28;
          }
          pfVar1 = (float *)(puVar31 + -1);
          puVar31 = puVar31 + -2;
        } while (auVar50._0_4_ < *pfVar1);
        uVar34 = *puVar31;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar34 & 8) == 0) {
              auVar37 = vmaxps_avx(auVar47,*(undefined1 (*) [32])(uVar34 + 0x40));
              auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar34 + 0x60));
              auVar35 = vsubps_avx(auVar37,auVar47);
              auVar37 = vmaxps_avx(auVar48,*(undefined1 (*) [32])(uVar34 + 0x80));
              auVar14 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar34 + 0xa0));
              auVar37 = vmaxps_avx(auVar51,*(undefined1 (*) [32])(uVar34 + 0xc0));
              auVar14 = vsubps_avx(auVar14,auVar48);
              auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar34 + 0xe0));
              auVar37 = vsubps_avx(auVar37,auVar51);
              auVar36._0_4_ =
                   auVar35._0_4_ * auVar35._0_4_ + auVar14._0_4_ * auVar14._0_4_ +
                   auVar37._0_4_ * auVar37._0_4_;
              auVar36._4_4_ =
                   auVar35._4_4_ * auVar35._4_4_ + auVar14._4_4_ * auVar14._4_4_ +
                   auVar37._4_4_ * auVar37._4_4_;
              auVar36._8_4_ =
                   auVar35._8_4_ * auVar35._8_4_ + auVar14._8_4_ * auVar14._8_4_ +
                   auVar37._8_4_ * auVar37._8_4_;
              auVar36._12_4_ =
                   auVar35._12_4_ * auVar35._12_4_ + auVar14._12_4_ * auVar14._12_4_ +
                   auVar37._12_4_ * auVar37._12_4_;
              auVar36._16_4_ =
                   auVar35._16_4_ * auVar35._16_4_ + auVar14._16_4_ * auVar14._16_4_ +
                   auVar37._16_4_ * auVar37._16_4_;
              auVar36._20_4_ =
                   auVar35._20_4_ * auVar35._20_4_ + auVar14._20_4_ * auVar14._20_4_ +
                   auVar37._20_4_ * auVar37._20_4_;
              auVar36._24_4_ =
                   auVar35._24_4_ * auVar35._24_4_ + auVar14._24_4_ * auVar14._24_4_ +
                   auVar37._24_4_ * auVar37._24_4_;
              auVar36._28_4_ = auVar35._28_4_ + auVar14._28_4_ + auVar14._28_4_;
              in_ZMM7 = ZEXT3264(auVar36);
              uVar19 = vcmpps_avx512vl(auVar36,in_ZMM15._0_32_,2);
              uVar20 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40),
                                       *(undefined1 (*) [32])(uVar34 + 0x60),2);
              unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),
                                   (uint)(byte)((byte)uVar19 & (byte)uVar20));
            }
          }
          else if ((uVar34 & 8) == 0) {
            auVar37 = *(undefined1 (*) [32])(uVar34 + 0x40);
            auVar14 = *(undefined1 (*) [32])(uVar34 + 0x60);
            auVar35 = vmaxps_avx(auVar47,auVar37);
            auVar35 = vminps_avx(auVar35,auVar14);
            auVar36 = vsubps_avx(auVar35,auVar47);
            auVar35 = vmaxps_avx(auVar48,*(undefined1 (*) [32])(uVar34 + 0x80));
            auVar35 = vminps_avx(auVar35,*(undefined1 (*) [32])(uVar34 + 0xa0));
            auVar39 = vsubps_avx(auVar35,auVar48);
            auVar35 = vmaxps_avx(auVar51,*(undefined1 (*) [32])(uVar34 + 0xc0));
            auVar35 = vminps_avx(auVar35,*(undefined1 (*) [32])(uVar34 + 0xe0));
            auVar35 = vsubps_avx(auVar35,auVar51);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar36._28_4_ + auVar39._28_4_ + auVar39._28_4_,
                                         CONCAT424(auVar36._24_4_ * auVar36._24_4_ +
                                                   auVar39._24_4_ * auVar39._24_4_ +
                                                   auVar35._24_4_ * auVar35._24_4_,
                                                   CONCAT420(auVar36._20_4_ * auVar36._20_4_ +
                                                             auVar39._20_4_ * auVar39._20_4_ +
                                                             auVar35._20_4_ * auVar35._20_4_,
                                                             CONCAT416(auVar36._16_4_ *
                                                                       auVar36._16_4_ +
                                                                       auVar39._16_4_ *
                                                                       auVar39._16_4_ +
                                                                       auVar35._16_4_ *
                                                                       auVar35._16_4_,
                                                                       CONCAT412(auVar36._12_4_ *
                                                                                 auVar36._12_4_ +
                                                                                 auVar39._12_4_ *
                                                                                 auVar39._12_4_ +
                                                                                 auVar35._12_4_ *
                                                                                 auVar35._12_4_,
                                                                                 CONCAT48(auVar36.
                                                  _8_4_ * auVar36._8_4_ +
                                                  auVar39._8_4_ * auVar39._8_4_ +
                                                  auVar35._8_4_ * auVar35._8_4_,
                                                  CONCAT44(auVar36._4_4_ * auVar36._4_4_ +
                                                           auVar39._4_4_ * auVar39._4_4_ +
                                                           auVar35._4_4_ * auVar35._4_4_,
                                                           auVar36._0_4_ * auVar36._0_4_ +
                                                           auVar39._0_4_ * auVar39._0_4_ +
                                                           auVar35._0_4_ * auVar35._0_4_))))))));
            uVar19 = vcmpps_avx512vl(auVar37,auVar14,2);
            uVar20 = vcmpps_avx512vl(auVar14,auVar18,1);
            auVar35._4_4_ = fVar2 + fVar8;
            auVar35._0_4_ = fVar2 + fVar7;
            auVar35._8_4_ = fVar2 + fVar9;
            auVar35._12_4_ = fVar2 + fVar10;
            auVar35._16_4_ = fVar2 + fVar11;
            auVar35._20_4_ = fVar2 + fVar12;
            auVar35._24_4_ = fVar2 + fVar13;
            auVar35._28_4_ = fVar2 + auVar41._28_4_;
            uVar21 = vcmpps_avx512vl(auVar37,auVar35,6);
            uVar22 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0xa0),auVar15,1);
            auVar14._4_4_ = fVar3 + auVar42._4_4_;
            auVar14._0_4_ = fVar3 + auVar42._0_4_;
            auVar14._8_4_ = fVar3 + auVar42._8_4_;
            auVar14._12_4_ = fVar3 + auVar42._12_4_;
            auVar14._16_4_ = fVar3 + auVar42._16_4_;
            auVar14._20_4_ = fVar3 + auVar42._20_4_;
            auVar14._24_4_ = fVar3 + auVar42._24_4_;
            auVar14._28_4_ = fVar3 + auVar42._28_4_;
            uVar23 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x80),auVar14,6);
            uVar24 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0xe0),auVar16,1);
            uVar25 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0xc0),auVar43,6);
            unaff_RBP = (ulong)(byte)(~((byte)uVar23 | (byte)uVar21 | (byte)uVar25 | (byte)uVar20 |
                                       (byte)uVar22 | (byte)uVar24) & (byte)uVar19);
          }
          if ((uVar34 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar29 = 4;
            }
            else {
              auVar37 = *(undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0);
              auVar14 = ((undefined1 (*) [32])(uVar34 & 0xfffffffffffffff0))[1];
              auVar46 = in_ZMM7._0_32_;
              auVar35 = vpternlogd_avx512vl(auVar52._0_32_,auVar46,auVar53._0_32_,0xf8);
              uVar34 = unaff_RBP & 0xffffffff;
              auVar36 = vpcompressd_avx512vl(auVar35);
              bVar27 = (bool)((byte)uVar34 & 1);
              auVar39._0_4_ = (uint)bVar27 * auVar36._0_4_ | (uint)!bVar27 * auVar35._0_4_;
              bVar27 = (bool)((byte)(uVar34 >> 1) & 1);
              auVar39._4_4_ = (uint)bVar27 * auVar36._4_4_ | (uint)!bVar27 * auVar35._4_4_;
              bVar27 = (bool)((byte)(uVar34 >> 2) & 1);
              auVar39._8_4_ = (uint)bVar27 * auVar36._8_4_ | (uint)!bVar27 * auVar35._8_4_;
              bVar27 = (bool)((byte)(uVar34 >> 3) & 1);
              auVar39._12_4_ = (uint)bVar27 * auVar36._12_4_ | (uint)!bVar27 * auVar35._12_4_;
              bVar27 = (bool)((byte)(uVar34 >> 4) & 1);
              auVar39._16_4_ = (uint)bVar27 * auVar36._16_4_ | (uint)!bVar27 * auVar35._16_4_;
              bVar27 = (bool)((byte)(uVar34 >> 5) & 1);
              auVar39._20_4_ = (uint)bVar27 * auVar36._20_4_ | (uint)!bVar27 * auVar35._20_4_;
              bVar27 = (bool)((byte)(uVar34 >> 6) & 1);
              auVar39._24_4_ = (uint)bVar27 * auVar36._24_4_ | (uint)!bVar27 * auVar35._24_4_;
              bVar27 = (bool)((byte)(uVar34 >> 7) & 1);
              auVar39._28_4_ = (uint)bVar27 * auVar36._28_4_ | (uint)!bVar27 * auVar35._28_4_;
              auVar35 = vpermt2q_avx512vl(auVar37,auVar39,auVar14);
              uVar34 = auVar35._0_8_;
              iVar29 = 0;
              uVar30 = unaff_RBP - 1 & unaff_RBP;
              if (uVar30 != 0) {
                auVar35 = vpshufd_avx2(auVar39,0x55);
                vpermt2q_avx512vl(auVar37,auVar35,auVar14);
                auVar36 = vpminsd_avx2(auVar39,auVar35);
                auVar35 = vpmaxsd_avx2(auVar39,auVar35);
                uVar30 = uVar30 - 1 & uVar30;
                if (uVar30 == 0) {
                  auVar36 = vpermi2q_avx512vl(auVar36,auVar37,auVar14);
                  uVar34 = auVar36._0_8_;
                  auVar37 = vpermt2q_avx512vl(auVar37,auVar35,auVar14);
                  *puVar31 = auVar37._0_8_;
                  auVar37 = vpermd_avx2(auVar35,auVar46);
                  *(int *)(puVar31 + 1) = auVar37._0_4_;
                  puVar31 = puVar31 + 2;
                }
                else {
                  auVar44 = vpshufd_avx2(auVar39,0xaa);
                  vpermt2q_avx512vl(auVar37,auVar44,auVar14);
                  auVar40 = vpminsd_avx2(auVar36,auVar44);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar44);
                  auVar44 = vpminsd_avx2(auVar35,auVar36);
                  auVar35 = vpmaxsd_avx2(auVar35,auVar36);
                  uVar30 = uVar30 - 1 & uVar30;
                  if (uVar30 == 0) {
                    auVar36 = vpermi2q_avx512vl(auVar40,auVar37,auVar14);
                    uVar34 = auVar36._0_8_;
                    auVar36 = vpermt2q_avx512vl(auVar37,auVar35,auVar14);
                    *puVar31 = auVar36._0_8_;
                    auVar35 = vpermd_avx2(auVar35,auVar46);
                    *(int *)(puVar31 + 1) = auVar35._0_4_;
                    auVar37 = vpermt2q_avx512vl(auVar37,auVar44,auVar14);
                    puVar31[2] = auVar37._0_8_;
                    auVar37 = vpermd_avx2(auVar44,auVar46);
                    *(int *)(puVar31 + 3) = auVar37._0_4_;
                    puVar31 = puVar31 + 4;
                  }
                  else {
                    auVar36 = vpshufd_avx2(auVar39,0xff);
                    vpermt2q_avx512vl(auVar37,auVar36,auVar14);
                    auVar17 = vpminsd_avx2(auVar40,auVar36);
                    auVar36 = vpmaxsd_avx2(auVar40,auVar36);
                    auVar40 = vpminsd_avx2(auVar44,auVar36);
                    auVar36 = vpmaxsd_avx2(auVar44,auVar36);
                    auVar44 = vpminsd_avx2(auVar35,auVar36);
                    auVar35 = vpmaxsd_avx2(auVar35,auVar36);
                    uVar30 = uVar30 - 1 & uVar30;
                    if (uVar30 == 0) {
                      auVar36 = vpermi2q_avx512vl(auVar17,auVar37,auVar14);
                      uVar34 = auVar36._0_8_;
                      auVar36 = vpermt2q_avx512vl(auVar37,auVar35,auVar14);
                      *puVar31 = auVar36._0_8_;
                      auVar35 = vpermd_avx2(auVar35,auVar46);
                      *(int *)(puVar31 + 1) = auVar35._0_4_;
                      auVar35 = vpermt2q_avx512vl(auVar37,auVar44,auVar14);
                      puVar31[2] = auVar35._0_8_;
                      auVar35 = vpermd_avx2(auVar44,auVar46);
                      *(int *)(puVar31 + 3) = auVar35._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar37,auVar40,auVar14);
                      puVar31[4] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar40,auVar46);
                      *(int *)(puVar31 + 5) = auVar37._0_4_;
                      puVar31 = puVar31 + 6;
                    }
                    else {
                      auVar38 = valignd_avx512vl(auVar39,auVar39,3);
                      auVar36 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar39 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar36,auVar17);
                      auVar36 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar39 = vpermt2d_avx512vl(auVar39,auVar36,auVar40);
                      auVar39 = vpermt2d_avx512vl(auVar39,auVar36,auVar44);
                      auVar36 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar35 = vpermt2d_avx512vl(auVar39,auVar36,auVar35);
                      auVar45 = ZEXT3264(auVar35);
                      uVar34 = uVar30;
                      do {
                        auVar36 = auVar45._0_32_;
                        auVar44._8_4_ = 1;
                        auVar44._0_8_ = 0x100000001;
                        auVar44._12_4_ = 1;
                        auVar44._16_4_ = 1;
                        auVar44._20_4_ = 1;
                        auVar44._24_4_ = 1;
                        auVar44._28_4_ = 1;
                        auVar35 = vpermd_avx2(auVar44,auVar38);
                        auVar38 = valignd_avx512vl(auVar38,auVar38,1);
                        vpermt2q_avx512vl(auVar37,auVar38,auVar14);
                        uVar34 = uVar34 - 1 & uVar34;
                        uVar19 = vpcmpd_avx512vl(auVar35,auVar36,5);
                        auVar35 = vpmaxsd_avx2(auVar35,auVar36);
                        bVar26 = (byte)uVar19 << 1;
                        auVar36 = valignd_avx512vl(auVar36,auVar36,7);
                        bVar27 = (bool)((byte)uVar19 & 1);
                        auVar40._4_4_ = (uint)bVar27 * auVar36._4_4_ | (uint)!bVar27 * auVar35._4_4_
                        ;
                        auVar40._0_4_ = auVar35._0_4_;
                        bVar27 = (bool)(bVar26 >> 2 & 1);
                        auVar40._8_4_ = (uint)bVar27 * auVar36._8_4_ | (uint)!bVar27 * auVar35._8_4_
                        ;
                        bVar27 = (bool)(bVar26 >> 3 & 1);
                        auVar40._12_4_ =
                             (uint)bVar27 * auVar36._12_4_ | (uint)!bVar27 * auVar35._12_4_;
                        bVar27 = (bool)(bVar26 >> 4 & 1);
                        auVar40._16_4_ =
                             (uint)bVar27 * auVar36._16_4_ | (uint)!bVar27 * auVar35._16_4_;
                        bVar27 = (bool)(bVar26 >> 5 & 1);
                        auVar40._20_4_ =
                             (uint)bVar27 * auVar36._20_4_ | (uint)!bVar27 * auVar35._20_4_;
                        bVar27 = (bool)(bVar26 >> 6 & 1);
                        auVar40._24_4_ =
                             (uint)bVar27 * auVar36._24_4_ | (uint)!bVar27 * auVar35._24_4_;
                        auVar40._28_4_ =
                             (uint)(bVar26 >> 7) * auVar36._28_4_ |
                             (uint)!(bool)(bVar26 >> 7) * auVar35._28_4_;
                        auVar45 = ZEXT3264(auVar40);
                      } while (uVar34 != 0);
                      lVar33 = POPCOUNT(uVar30) + 3;
                      do {
                        auVar35 = vpermi2q_avx512vl(auVar40,auVar37,auVar14);
                        *puVar31 = auVar35._0_8_;
                        auVar36 = auVar45._0_32_;
                        auVar35 = vpermd_avx2(auVar36,auVar46);
                        *(int *)(puVar31 + 1) = auVar35._0_4_;
                        auVar40 = valignd_avx512vl(auVar36,auVar36,1);
                        puVar31 = puVar31 + 2;
                        auVar45 = ZEXT3264(auVar40);
                        lVar33 = lVar33 + -1;
                      } while (lVar33 != 0);
                      auVar37 = vpermt2q_avx512vl(auVar37,auVar40,auVar14);
                      uVar34 = auVar37._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar46);
                    in_ZMM15 = ZEXT3264(in_ZMM15._0_32_);
                    iVar29 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
      } while ((iVar29 != 6) || (lVar33 = (ulong)((uint)uVar34 & 0xf) - 8, lVar33 == 0));
      prim = (Primitive *)(uVar34 & 0xfffffffffffffff0);
      bVar26 = 0;
      do {
        bVar32 = bVar26;
        bVar27 = InstanceArrayIntersector1::pointQuery(query,context,prim);
        prim = prim + 1;
        lVar33 = lVar33 + -1;
        bVar26 = bVar32 | bVar27;
      } while (lVar33 != 0);
      auVar50 = ZEXT1664(auVar49);
      auVar37 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar52 = ZEXT3264(auVar37);
      auVar53 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
      in_ZMM15 = ZEXT3264(auVar54._0_32_);
    } while (bVar32 == 0 && !bVar27);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar41._4_4_ = uVar5;
    auVar41._0_4_ = uVar5;
    auVar41._8_4_ = uVar5;
    auVar41._12_4_ = uVar5;
    auVar41._16_4_ = uVar5;
    auVar41._20_4_ = uVar5;
    auVar41._24_4_ = uVar5;
    auVar41._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar42._4_4_ = uVar5;
    auVar42._0_4_ = uVar5;
    auVar42._8_4_ = uVar5;
    auVar42._12_4_ = uVar5;
    auVar42._16_4_ = uVar5;
    auVar42._20_4_ = uVar5;
    auVar42._24_4_ = uVar5;
    auVar42._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar37._4_4_ = uVar5;
    auVar37._0_4_ = uVar5;
    auVar37._8_4_ = uVar5;
    auVar37._12_4_ = uVar5;
    auVar37._16_4_ = uVar5;
    auVar37._20_4_ = uVar5;
    auVar37._24_4_ = uVar5;
    auVar37._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar50 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar49 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar50 = ZEXT1664(auVar49);
    }
    bVar28 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }